

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_InCaselessSetWithDefault_Test::~TApp_InCaselessSetWithDefault_Test
          (TApp_InCaselessSetWithDefault_Test *this)

{
  TApp_InCaselessSetWithDefault_Test *this_local;
  
  ~TApp_InCaselessSetWithDefault_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, InCaselessSetWithDefault) {

    std::string choice = "one";
    app.add_set_ignore_case("-q,--quick", choice, {"one", "two", "three"}, "", true);

    run();
    EXPECT_EQ("one", choice);
    app.reset();

    args = {"--quick", "tWo"};

    run();
    EXPECT_EQ("two", choice);

    app.reset();

    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);
}